

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  bool bVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  NodeRef *pNVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  InstancePrimitive *prim;
  undefined4 uVar21;
  ulong unaff_R13;
  size_t mask;
  int iVar22;
  bool bVar23;
  float fVar24;
  float fVar27;
  float fVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar29 [16];
  float fVar32;
  undefined1 auVar30 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar24 = ray->tfar;
    if (0.0 <= fVar24) {
      pNVar15 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar1 = (ray->dir).field_0;
      auVar2 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar29 = vandps_avx((undefined1  [16])aVar1,auVar29);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar29 = vcmpps_avx(auVar29,auVar33,1);
      auVar29 = vblendvps_avx((undefined1  [16])aVar1,auVar33,auVar29);
      auVar33 = vrcpps_avx(auVar29);
      fVar27 = auVar33._0_4_;
      auVar25._0_4_ = fVar27 * auVar29._0_4_;
      fVar28 = auVar33._4_4_;
      auVar25._4_4_ = fVar28 * auVar29._4_4_;
      fVar31 = auVar33._8_4_;
      auVar25._8_4_ = fVar31 * auVar29._8_4_;
      fVar32 = auVar33._12_4_;
      auVar25._12_4_ = fVar32 * auVar29._12_4_;
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = &DAT_3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar34,auVar25);
      auVar26._0_4_ = fVar27 + fVar27 * auVar29._0_4_;
      auVar26._4_4_ = fVar28 + fVar28 * auVar29._4_4_;
      auVar26._8_4_ = fVar31 + fVar31 * auVar29._8_4_;
      auVar26._12_4_ = fVar32 + fVar32 * auVar29._12_4_;
      uVar21 = *(undefined4 *)&(ray->org).field_0;
      auVar36._4_4_ = uVar21;
      auVar36._0_4_ = uVar21;
      auVar36._8_4_ = uVar21;
      auVar36._12_4_ = uVar21;
      auVar36._16_4_ = uVar21;
      auVar36._20_4_ = uVar21;
      auVar36._24_4_ = uVar21;
      auVar36._28_4_ = uVar21;
      uVar21 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar37._4_4_ = uVar21;
      auVar37._0_4_ = uVar21;
      auVar37._8_4_ = uVar21;
      auVar37._12_4_ = uVar21;
      auVar37._16_4_ = uVar21;
      auVar37._20_4_ = uVar21;
      auVar37._24_4_ = uVar21;
      auVar37._28_4_ = uVar21;
      uVar21 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar38._4_4_ = uVar21;
      auVar38._0_4_ = uVar21;
      auVar38._8_4_ = uVar21;
      auVar38._12_4_ = uVar21;
      auVar38._16_4_ = uVar21;
      auVar38._20_4_ = uVar21;
      auVar38._24_4_ = uVar21;
      auVar38._28_4_ = uVar21;
      auVar25 = vshufps_avx(auVar26,auVar26,0);
      auVar29 = vmovshdup_avx(auVar26);
      auVar34 = vshufps_avx(auVar26,auVar26,0x55);
      auVar33 = vshufpd_avx(auVar26,auVar26,1);
      auVar3 = vshufps_avx(auVar26,auVar26,0xaa);
      uVar16 = (ulong)(auVar26._0_4_ < 0.0) * 0x20;
      uVar17 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x40;
      uVar18 = (ulong)(auVar33._0_4_ < 0.0) << 5 | 0x80;
      auVar29 = vshufps_avx(auVar2,auVar2,0);
      auVar30._16_16_ = auVar29;
      auVar30._0_16_ = auVar29;
      auVar29 = vshufps_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),0);
      auVar35._16_16_ = auVar29;
      auVar35._0_16_ = auVar29;
      do {
        if (pNVar15 == stack) {
          return;
        }
        sVar20 = pNVar15[-1].ptr;
        pNVar15 = pNVar15 + -1;
        do {
          if ((sVar20 & 8) == 0) {
            auVar4 = vsubps_avx(*(undefined1 (*) [32])(sVar20 + 0x40 + uVar16),auVar36);
            fVar31 = auVar25._0_4_;
            fVar32 = auVar25._4_4_;
            auVar5._4_4_ = fVar32 * auVar4._4_4_;
            auVar5._0_4_ = fVar31 * auVar4._0_4_;
            fVar39 = auVar25._8_4_;
            auVar5._8_4_ = fVar39 * auVar4._8_4_;
            auVar5._12_4_ = auVar25._12_4_ * auVar4._12_4_;
            auVar5._16_4_ = fVar31 * auVar4._16_4_;
            auVar5._20_4_ = fVar32 * auVar4._20_4_;
            auVar5._24_4_ = fVar39 * auVar4._24_4_;
            auVar5._28_4_ = auVar4._28_4_;
            auVar4 = vsubps_avx(*(undefined1 (*) [32])(sVar20 + 0x40 + uVar17),auVar37);
            fVar40 = auVar34._0_4_;
            fVar41 = auVar34._4_4_;
            auVar6._4_4_ = fVar41 * auVar4._4_4_;
            auVar6._0_4_ = fVar40 * auVar4._0_4_;
            fVar42 = auVar34._8_4_;
            auVar6._8_4_ = fVar42 * auVar4._8_4_;
            auVar6._12_4_ = auVar34._12_4_ * auVar4._12_4_;
            auVar6._16_4_ = fVar40 * auVar4._16_4_;
            auVar6._20_4_ = fVar41 * auVar4._20_4_;
            auVar6._24_4_ = fVar42 * auVar4._24_4_;
            auVar6._28_4_ = auVar4._28_4_;
            auVar4 = vmaxps_avx(auVar5,auVar6);
            auVar5 = vsubps_avx(*(undefined1 (*) [32])(sVar20 + 0x40 + uVar18),auVar38);
            fVar24 = auVar3._0_4_;
            fVar27 = auVar3._4_4_;
            auVar7._4_4_ = fVar27 * auVar5._4_4_;
            auVar7._0_4_ = fVar24 * auVar5._0_4_;
            fVar28 = auVar3._8_4_;
            auVar7._8_4_ = fVar28 * auVar5._8_4_;
            auVar7._12_4_ = auVar3._12_4_ * auVar5._12_4_;
            auVar7._16_4_ = fVar24 * auVar5._16_4_;
            auVar7._20_4_ = fVar27 * auVar5._20_4_;
            auVar7._24_4_ = fVar28 * auVar5._24_4_;
            auVar7._28_4_ = auVar5._28_4_;
            auVar5 = vmaxps_avx(auVar7,auVar30);
            auVar4 = vmaxps_avx(auVar4,auVar5);
            auVar5 = vsubps_avx(*(undefined1 (*) [32])(sVar20 + 0x40 + (uVar16 ^ 0x20)),auVar36);
            auVar8._4_4_ = fVar32 * auVar5._4_4_;
            auVar8._0_4_ = fVar31 * auVar5._0_4_;
            auVar8._8_4_ = fVar39 * auVar5._8_4_;
            auVar8._12_4_ = auVar25._12_4_ * auVar5._12_4_;
            auVar8._16_4_ = fVar31 * auVar5._16_4_;
            auVar8._20_4_ = fVar32 * auVar5._20_4_;
            auVar8._24_4_ = fVar39 * auVar5._24_4_;
            auVar8._28_4_ = auVar5._28_4_;
            auVar5 = vsubps_avx(*(undefined1 (*) [32])(sVar20 + 0x40 + (uVar17 ^ 0x20)),auVar37);
            auVar9._4_4_ = fVar41 * auVar5._4_4_;
            auVar9._0_4_ = fVar40 * auVar5._0_4_;
            auVar9._8_4_ = fVar42 * auVar5._8_4_;
            auVar9._12_4_ = auVar34._12_4_ * auVar5._12_4_;
            auVar9._16_4_ = fVar40 * auVar5._16_4_;
            auVar9._20_4_ = fVar41 * auVar5._20_4_;
            auVar9._24_4_ = fVar42 * auVar5._24_4_;
            auVar9._28_4_ = auVar5._28_4_;
            auVar5 = vminps_avx(auVar8,auVar9);
            auVar6 = vsubps_avx(*(undefined1 (*) [32])(sVar20 + 0x40 + (uVar18 ^ 0x20)),auVar38);
            auVar10._4_4_ = fVar27 * auVar6._4_4_;
            auVar10._0_4_ = fVar24 * auVar6._0_4_;
            auVar10._8_4_ = fVar28 * auVar6._8_4_;
            auVar10._12_4_ = auVar3._12_4_ * auVar6._12_4_;
            auVar10._16_4_ = fVar24 * auVar6._16_4_;
            auVar10._20_4_ = fVar27 * auVar6._20_4_;
            auVar10._24_4_ = fVar28 * auVar6._24_4_;
            auVar10._28_4_ = auVar6._28_4_;
            auVar6 = vminps_avx(auVar10,auVar35);
            auVar5 = vminps_avx(auVar5,auVar6);
            auVar4 = vcmpps_avx(auVar4,auVar5,2);
            uVar21 = vmovmskps_avx(auVar4);
            unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar21);
          }
          if ((sVar20 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar22 = 4;
            }
            else {
              uVar19 = sVar20 & 0xfffffffffffffff0;
              lVar13 = 0;
              if (unaff_R13 != 0) {
                for (; (unaff_R13 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              iVar22 = 0;
              sVar20 = *(size_t *)(uVar19 + lVar13 * 8);
              uVar14 = unaff_R13 - 1 & unaff_R13;
              if (uVar14 != 0) {
                pNVar15->ptr = sVar20;
                lVar13 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                uVar12 = uVar14 - 1;
                while( true ) {
                  pNVar15 = pNVar15 + 1;
                  sVar20 = *(size_t *)(uVar19 + lVar13 * 8);
                  uVar12 = uVar12 & uVar14;
                  if (uVar12 == 0) break;
                  pNVar15->ptr = sVar20;
                  lVar13 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                    }
                  }
                  uVar14 = uVar12 - 1;
                }
              }
            }
          }
          else {
            iVar22 = 6;
          }
        } while (iVar22 == 0);
        if (iVar22 == 6) {
          uVar19 = (ulong)((uint)sVar20 & 0xf);
          iVar22 = 0;
          bVar23 = uVar19 != 8;
          if (bVar23) {
            prim = (InstancePrimitive *)(sVar20 & 0xfffffffffffffff0);
            bVar11 = InstanceIntersector1::occluded(&pre,ray,context,prim);
            if (!bVar11) {
              uVar14 = 0;
              do {
                prim = prim + 1;
                if (uVar19 - 9 == uVar14) goto LAB_0031285c;
                bVar23 = InstanceIntersector1::occluded(&pre,ray,context,prim);
                uVar14 = uVar14 + 1;
              } while (!bVar23);
              bVar23 = uVar14 < uVar19 - 8;
            }
            iVar22 = 0;
            if (bVar23) {
              ray->tfar = -INFINITY;
              iVar22 = 3;
            }
          }
        }
LAB_0031285c:
      } while (iVar22 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }